

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzgeoelrefless.h.h
# Opt level: O0

void __thiscall
TPZGeoElRefLess<pzgeom::TPZArc3D>::TPZGeoElRefLess
          (TPZGeoElRefLess<pzgeom::TPZArc3D> *this,void **vtt,TPZGeoMesh *DestMesh,
          TPZGeoElRefLess<pzgeom::TPZArc3D> *cp,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcNdMap,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcElMap)

{
  bool bVar1;
  TPZGeoEl *pTVar2;
  TPZGeoEl *in_RCX;
  TPZArc3D *in_RSI;
  TPZArc3D *in_RDI;
  int side;
  int64_t neighIdx;
  TPZGeoElSide neigh;
  int n;
  int i;
  map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_> *in_stack_000002c0
  ;
  TPZGeoEl *in_stack_000002c8;
  TPZGeoMesh *in_stack_000002d0;
  void **in_stack_000002d8;
  TPZGeoEl *in_stack_000002e0;
  TPZGeoElSide *in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffef0;
  int in_stack_fffffffffffffef4;
  TPZGeoElSide *in_stack_fffffffffffffef8;
  TPZGeoMesh *in_stack_ffffffffffffff00;
  iterator in_stack_ffffffffffffff08;
  TPZGeoElSide *this_00;
  int *__k;
  map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
  *in_stack_ffffffffffffff30;
  TPZManVector<int,_5> *this_01;
  TPZGeoElSideIndex local_b0 [2];
  _Self local_80;
  _Self local_78;
  int local_6c;
  int64_t local_68;
  TPZGeoElSide local_60;
  undefined4 local_44;
  int local_40;
  TPZGeoEl *local_20;
  
  local_20 = in_RCX;
  TPZGeoEl::TPZGeoEl(in_stack_000002e0,in_stack_000002d8,in_stack_000002d0,in_stack_000002c8,
                     in_stack_000002c0);
  (in_RDI->super_TPZNodeRep<3,_pztopology::TPZLine>).super_TPZLine.super_TPZSavable._vptr_TPZSavable
       = (in_RSI->super_TPZNodeRep<3,_pztopology::TPZLine>).super_TPZLine.super_TPZSavable.
         _vptr_TPZSavable;
  *(int64_t *)
   ((long)(in_RDI->super_TPZNodeRep<3,_pztopology::TPZLine>).fNodeIndexes +
   (long)((in_RDI->super_TPZNodeRep<3,_pztopology::TPZLine>).super_TPZLine.super_TPZSavable.
          _vptr_TPZSavable[-0xc] + -8)) =
       (in_RSI->super_TPZNodeRep<3,_pztopology::TPZLine>).fNodeIndexes[2];
  pzgeom::TPZArc3D::TPZArc3D(in_RDI,in_RSI,in_stack_ffffffffffffff30);
  this_01 = (TPZManVector<int,_5> *)&in_RDI[1].fICnBase.super_TPZFMatrix<double>.fElem;
  __k = in_RDI[1].fICnBase.super_TPZFMatrix<double>.fPivot.fExtAlloc + 4;
  do {
    TPZGeoElSideIndex::TPZGeoElSideIndex
              ((TPZGeoElSideIndex *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
    this_01 = (TPZManVector<int,_5> *)((long)&this_01->super_TPZVec<int> + 0x18);
  } while (this_01 != (TPZManVector<int,_5> *)__k);
  local_44 = 3;
  for (local_40 = 0; local_40 < 3; local_40 = local_40 + 1) {
    this_00 = (TPZGeoElSide *)(&local_20[10].fIndex + (long)local_40 * 3);
    TPZGeoEl::Mesh(local_20);
    TPZGeoElSide::TPZGeoElSide
              (this_00,(TPZGeoElSideIndex *)in_stack_ffffffffffffff08._M_node,
               in_stack_ffffffffffffff00);
    pTVar2 = TPZGeoElSide::Element(&local_60);
    local_68 = TPZGeoEl::Index(pTVar2);
    local_6c = TPZGeoElSide::Side(&local_60);
    while( true ) {
      in_stack_ffffffffffffff08 =
           std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::
           find((map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_> *)
                in_stack_fffffffffffffee8,(key_type_conflict1 *)0x18015d4);
      local_78._M_node = in_stack_ffffffffffffff08._M_node;
      local_80._M_node =
           (_Base_ptr)
           std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::end
                     ((map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
                       *)in_stack_fffffffffffffee8);
      bVar1 = std::operator==(&local_78,&local_80);
      if (!bVar1) break;
      TPZGeoElSide::Neighbour(in_stack_fffffffffffffef8);
      TPZGeoElSide::operator=
                ((TPZGeoElSide *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                 in_stack_fffffffffffffee8);
      TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1801654);
      pTVar2 = TPZGeoElSide::Element(&local_60);
      local_68 = TPZGeoEl::Index(pTVar2);
      local_6c = TPZGeoElSide::Side(&local_60);
    }
    in_stack_ffffffffffffff00 =
         (TPZGeoMesh *)
         std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::
         operator[]((map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
                     *)this_01,(key_type_conflict1 *)__k);
    TPZGeoElSideIndex::TPZGeoElSideIndex
              ((TPZGeoElSideIndex *)in_stack_ffffffffffffff00,(int64_t)in_stack_fffffffffffffef8,
               in_stack_fffffffffffffef4);
    TPZGeoElSideIndex::operator=
              ((TPZGeoElSideIndex *)
               (in_RDI[1].fICnBase.super_TPZFMatrix<double>.fPivot.fExtAlloc +
               (long)local_40 * 6 + -0xe),local_b0);
    TPZGeoElSideIndex::~TPZGeoElSideIndex((TPZGeoElSideIndex *)0x1801746);
    TPZGeoElSide::~TPZGeoElSide((TPZGeoElSide *)0x1801753);
  }
  return;
}

Assistant:

TPZGeoElRefLess<TGeo>::TPZGeoElRefLess( TPZGeoMesh &DestMesh,
									   const TPZGeoElRefLess &cp,
									   std::map<int64_t,int64_t> & gl2lcNdMap,
									   std::map<int64_t,int64_t> & gl2lcElMap ) :
TPZRegisterClassId(&TPZGeoElRefLess<TGeo>::ClassId),TPZGeoEl(DestMesh, cp, gl2lcElMap), fGeo(cp.fGeo, gl2lcNdMap)
{
	int i;
	const int n = TGeo::NSides;
	
	for(i = 0; i < n; i++)
	{
		TPZGeoElSide neigh (cp.fNeighbours[i],cp.Mesh());
		int64_t neighIdx = neigh.Element()->Index();
		int side = neigh.Side();
		
		while (gl2lcElMap.find(neighIdx)==gl2lcElMap.end())
		{
			neigh = neigh.Neighbour();
			neighIdx = neigh.Element()->Index();
			side = neigh.Side();
		}
		this->fNeighbours[i] = TPZGeoElSideIndex ( gl2lcElMap [ neighIdx ] , side );
	}
}